

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_lexer.cpp
# Opt level: O2

void __thiscall Lexer_Identifiers_Test::TestBody(Lexer_Identifiers_Test *this)

{
  int *lxr;
  int *lhs;
  int *lhs_00;
  anon_union_8_2_0c43866c_for_TkInfo_4 *this_00;
  char *pcVar1;
  undefined1 local_190 [8];
  MockLexer mock;
  AssertionResult gtest_ar;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_30;
  
  mock_new((MockLexer *)local_190,"hello _3hello h_e_ll_o h3ll0 _014 _h35_o");
  lxr = &mock.vm.stack_size;
  lex_next((Lexer *)lxr);
  lhs = &mock.lxr.cursor;
  local_30.ptr_._0_4_ = 0x114;
  testing::internal::CmpHelperEQ<int,multi_tks>
            ((internal *)&mock.lxr.tk.field_4,"mock.lxr.tk.type","TK_IDENT",lhs,
             (multi_tks *)&local_30);
  if (mock.lxr.tk.field_4.ident_hash._0_1_ == '\0') {
    testing::Message::Message((Message *)&local_30);
    if (gtest_ar._0_8_ == 0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = *(char **)gtest_ar._0_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar.message_,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_lexer.cpp"
               ,99,pcVar1);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&gtest_ar.message_,(Message *)&local_30);
  }
  else {
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&gtest_ar);
    lhs_00 = &mock.lxr.tk.length;
    local_30.ptr_ =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
         hash_string("hello",5);
    this_00 = &mock.lxr.tk.field_4;
    testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
              ((internal *)this_00,"mock.lxr.tk.ident_hash","hash_string(\"hello\", 5)",
               (unsigned_long *)lhs_00,(unsigned_long *)&local_30);
    if (mock.lxr.tk.field_4.ident_hash._0_1_ == '\0') {
      testing::Message::Message((Message *)&local_30);
      if (gtest_ar._0_8_ == 0) {
        pcVar1 = "";
      }
      else {
        pcVar1 = *(char **)gtest_ar._0_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar.message_,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_lexer.cpp"
                 ,100,pcVar1);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&gtest_ar.message_,(Message *)&local_30);
    }
    else {
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar);
      lex_next((Lexer *)lxr);
      local_30.ptr_._0_4_ = 0x114;
      testing::internal::CmpHelperEQ<int,multi_tks>
                ((internal *)this_00,"mock.lxr.tk.type","TK_IDENT",lhs,(multi_tks *)&local_30);
      if (mock.lxr.tk.field_4.ident_hash._0_1_ == '\0') {
        testing::Message::Message((Message *)&local_30);
        if (gtest_ar._0_8_ == 0) {
          pcVar1 = "";
        }
        else {
          pcVar1 = *(char **)gtest_ar._0_8_;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar.message_,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_lexer.cpp"
                   ,0x65,pcVar1);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&gtest_ar.message_,(Message *)&local_30);
      }
      else {
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&gtest_ar);
        local_30.ptr_ =
             (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
             hash_string("_3hello",7);
        testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
                  ((internal *)this_00,"mock.lxr.tk.ident_hash","hash_string(\"_3hello\", 7)",
                   (unsigned_long *)lhs_00,(unsigned_long *)&local_30);
        if (mock.lxr.tk.field_4.ident_hash._0_1_ == '\0') {
          testing::Message::Message((Message *)&local_30);
          if (gtest_ar._0_8_ == 0) {
            pcVar1 = "";
          }
          else {
            pcVar1 = *(char **)gtest_ar._0_8_;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&gtest_ar.message_,kFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_lexer.cpp"
                     ,0x66,pcVar1);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&gtest_ar.message_,(Message *)&local_30);
        }
        else {
          testing::internal::
          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)&gtest_ar);
          lex_next((Lexer *)lxr);
          local_30.ptr_._0_4_ = 0x114;
          testing::internal::CmpHelperEQ<int,multi_tks>
                    ((internal *)this_00,"mock.lxr.tk.type","TK_IDENT",lhs,(multi_tks *)&local_30);
          if (mock.lxr.tk.field_4.ident_hash._0_1_ == '\0') {
            testing::Message::Message((Message *)&local_30);
            if (gtest_ar._0_8_ == 0) {
              pcVar1 = "";
            }
            else {
              pcVar1 = *(char **)gtest_ar._0_8_;
            }
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&gtest_ar.message_,kFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_lexer.cpp"
                       ,0x67,pcVar1);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&gtest_ar.message_,(Message *)&local_30);
          }
          else {
            testing::internal::
            scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)&gtest_ar);
            local_30.ptr_ =
                 (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 hash_string("h_e_ll_o",8);
            testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
                      ((internal *)this_00,"mock.lxr.tk.ident_hash","hash_string(\"h_e_ll_o\", 8)",
                       (unsigned_long *)lhs_00,(unsigned_long *)&local_30);
            if (mock.lxr.tk.field_4.ident_hash._0_1_ == '\0') {
              testing::Message::Message((Message *)&local_30);
              if (gtest_ar._0_8_ == 0) {
                pcVar1 = "";
              }
              else {
                pcVar1 = *(char **)gtest_ar._0_8_;
              }
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&gtest_ar.message_,kFatalFailure,
                         "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_lexer.cpp"
                         ,0x68,pcVar1);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&gtest_ar.message_,(Message *)&local_30);
            }
            else {
              testing::internal::
              scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)&gtest_ar);
              lex_next((Lexer *)lxr);
              local_30.ptr_._0_4_ = 0x114;
              testing::internal::CmpHelperEQ<int,multi_tks>
                        ((internal *)this_00,"mock.lxr.tk.type","TK_IDENT",lhs,
                         (multi_tks *)&local_30);
              if (mock.lxr.tk.field_4.ident_hash._0_1_ == '\0') {
                testing::Message::Message((Message *)&local_30);
                if (gtest_ar._0_8_ == 0) {
                  pcVar1 = "";
                }
                else {
                  pcVar1 = *(char **)gtest_ar._0_8_;
                }
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)&gtest_ar.message_,kFatalFailure,
                           "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_lexer.cpp"
                           ,0x69,pcVar1);
                testing::internal::AssertHelper::operator=
                          ((AssertHelper *)&gtest_ar.message_,(Message *)&local_30);
              }
              else {
                testing::internal::
                scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               *)&gtest_ar);
                local_30.ptr_ =
                     (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     hash_string("h3ll0",5);
                testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
                          ((internal *)this_00,"mock.lxr.tk.ident_hash","hash_string(\"h3ll0\", 5)",
                           (unsigned_long *)lhs_00,(unsigned_long *)&local_30);
                if (mock.lxr.tk.field_4.ident_hash._0_1_ == '\0') {
                  testing::Message::Message((Message *)&local_30);
                  if (gtest_ar._0_8_ == 0) {
                    pcVar1 = "";
                  }
                  else {
                    pcVar1 = *(char **)gtest_ar._0_8_;
                  }
                  testing::internal::AssertHelper::AssertHelper
                            ((AssertHelper *)&gtest_ar.message_,kFatalFailure,
                             "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_lexer.cpp"
                             ,0x6a,pcVar1);
                  testing::internal::AssertHelper::operator=
                            ((AssertHelper *)&gtest_ar.message_,(Message *)&local_30);
                }
                else {
                  testing::internal::
                  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                 *)&gtest_ar);
                  lex_next((Lexer *)lxr);
                  local_30.ptr_._0_4_ = 0x114;
                  testing::internal::CmpHelperEQ<int,multi_tks>
                            ((internal *)this_00,"mock.lxr.tk.type","TK_IDENT",lhs,
                             (multi_tks *)&local_30);
                  if (mock.lxr.tk.field_4.ident_hash._0_1_ == '\0') {
                    testing::Message::Message((Message *)&local_30);
                    if (gtest_ar._0_8_ == 0) {
                      pcVar1 = "";
                    }
                    else {
                      pcVar1 = *(char **)gtest_ar._0_8_;
                    }
                    testing::internal::AssertHelper::AssertHelper
                              ((AssertHelper *)&gtest_ar.message_,kFatalFailure,
                               "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_lexer.cpp"
                               ,0x6b,pcVar1);
                    testing::internal::AssertHelper::operator=
                              ((AssertHelper *)&gtest_ar.message_,(Message *)&local_30);
                  }
                  else {
                    testing::internal::
                    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                   *)&gtest_ar);
                    local_30.ptr_ =
                         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         hash_string("_014",4);
                    testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
                              ((internal *)this_00,"mock.lxr.tk.ident_hash",
                               "hash_string(\"_014\", 4)",(unsigned_long *)lhs_00,
                               (unsigned_long *)&local_30);
                    if (mock.lxr.tk.field_4.ident_hash._0_1_ == '\0') {
                      testing::Message::Message((Message *)&local_30);
                      if (gtest_ar._0_8_ == 0) {
                        pcVar1 = "";
                      }
                      else {
                        pcVar1 = *(char **)gtest_ar._0_8_;
                      }
                      testing::internal::AssertHelper::AssertHelper
                                ((AssertHelper *)&gtest_ar.message_,kFatalFailure,
                                 "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_lexer.cpp"
                                 ,0x6c,pcVar1);
                      testing::internal::AssertHelper::operator=
                                ((AssertHelper *)&gtest_ar.message_,(Message *)&local_30);
                    }
                    else {
                      testing::internal::
                      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                     *)&gtest_ar);
                      lex_next((Lexer *)lxr);
                      local_30.ptr_._0_4_ = 0x114;
                      testing::internal::CmpHelperEQ<int,multi_tks>
                                ((internal *)this_00,"mock.lxr.tk.type","TK_IDENT",lhs,
                                 (multi_tks *)&local_30);
                      if (mock.lxr.tk.field_4.ident_hash._0_1_ == '\0') {
                        testing::Message::Message((Message *)&local_30);
                        if (gtest_ar._0_8_ == 0) {
                          pcVar1 = "";
                        }
                        else {
                          pcVar1 = *(char **)gtest_ar._0_8_;
                        }
                        testing::internal::AssertHelper::AssertHelper
                                  ((AssertHelper *)&gtest_ar.message_,kFatalFailure,
                                   "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_lexer.cpp"
                                   ,0x6d,pcVar1);
                        testing::internal::AssertHelper::operator=
                                  ((AssertHelper *)&gtest_ar.message_,(Message *)&local_30);
                      }
                      else {
                        testing::internal::
                        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                       *)&gtest_ar);
                        local_30.ptr_ =
                             (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                              *)hash_string("_h35_o",6);
                        testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
                                  ((internal *)this_00,"mock.lxr.tk.ident_hash",
                                   "hash_string(\"_h35_o\", 6)",(unsigned_long *)lhs_00,
                                   (unsigned_long *)&local_30);
                        if (mock.lxr.tk.field_4.ident_hash._0_1_ == '\0') {
                          testing::Message::Message((Message *)&local_30);
                          if (gtest_ar._0_8_ == 0) {
                            pcVar1 = "";
                          }
                          else {
                            pcVar1 = *(char **)gtest_ar._0_8_;
                          }
                          testing::internal::AssertHelper::AssertHelper
                                    ((AssertHelper *)&gtest_ar.message_,kFatalFailure,
                                     "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_lexer.cpp"
                                     ,0x6e,pcVar1);
                          testing::internal::AssertHelper::operator=
                                    ((AssertHelper *)&gtest_ar.message_,(Message *)&local_30);
                        }
                        else {
                          testing::internal::
                          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                         *)&gtest_ar);
                          lex_next((Lexer *)lxr);
                          local_30.ptr_._0_4_ = 0x119;
                          testing::internal::CmpHelperEQ<int,multi_tks>
                                    ((internal *)&mock.lxr.tk.field_4,"mock.lxr.tk.type","TK_EOF",
                                     lhs,(multi_tks *)&local_30);
                          if (mock.lxr.tk.field_4.ident_hash._0_1_ != '\0') {
                            testing::internal::
                            scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                           *)&gtest_ar);
                            vm_free((VM *)local_190);
                            return;
                          }
                          testing::Message::Message((Message *)&local_30);
                          if (gtest_ar._0_8_ == 0) {
                            pcVar1 = "";
                          }
                          else {
                            pcVar1 = *(char **)gtest_ar._0_8_;
                          }
                          testing::internal::AssertHelper::AssertHelper
                                    ((AssertHelper *)&gtest_ar.message_,kFatalFailure,
                                     "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_lexer.cpp"
                                     ,0x6f,pcVar1);
                          testing::internal::AssertHelper::operator=
                                    ((AssertHelper *)&gtest_ar.message_,(Message *)&local_30);
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar.message_);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr(&local_30);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&gtest_ar);
  return;
}

Assistant:

TEST(Lexer, Identifiers) {
	MockLexer mock = mock_new("hello _3hello h_e_ll_o h3ll0 _014 _h35_o");
	lex_next(&mock.lxr); ASSERT_EQ(mock.lxr.tk.type, TK_IDENT);
	ASSERT_EQ(mock.lxr.tk.ident_hash, hash_string("hello", 5));
	lex_next(&mock.lxr); ASSERT_EQ(mock.lxr.tk.type, TK_IDENT);
	ASSERT_EQ(mock.lxr.tk.ident_hash, hash_string("_3hello", 7));
	lex_next(&mock.lxr); ASSERT_EQ(mock.lxr.tk.type, TK_IDENT);
	ASSERT_EQ(mock.lxr.tk.ident_hash, hash_string("h_e_ll_o", 8));
	lex_next(&mock.lxr); ASSERT_EQ(mock.lxr.tk.type, TK_IDENT);
	ASSERT_EQ(mock.lxr.tk.ident_hash, hash_string("h3ll0", 5));
	lex_next(&mock.lxr); ASSERT_EQ(mock.lxr.tk.type, TK_IDENT);
	ASSERT_EQ(mock.lxr.tk.ident_hash, hash_string("_014", 4));
	lex_next(&mock.lxr); ASSERT_EQ(mock.lxr.tk.type, TK_IDENT);
	ASSERT_EQ(mock.lxr.tk.ident_hash, hash_string("_h35_o", 6));
	lex_next(&mock.lxr); ASSERT_EQ(mock.lxr.tk.type, TK_EOF);
	mock_free(&mock);
}